

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# particleSamples.cpp
# Opt level: O3

void __thiscall
particleSamples::boostParticles
          (particleSamples *this,
          vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
          *input_particle_list,double rap_shift)

{
  double dVar1;
  double dVar2;
  double dVar3;
  pointer ppvVar4;
  pointer paVar5;
  undefined1 auVar6 [16];
  vector<particle_info,_std::allocator<particle_info>_> **ev_i;
  pointer ppvVar7;
  anon_struct_120_15_f999644b *part_i;
  pointer paVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  
  ppvVar4 = (input_particle_list->
            super__Vector_base<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  for (ppvVar7 = (input_particle_list->
                 super__Vector_base<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
                 )._M_impl.super__Vector_impl_data._M_start; ppvVar7 != ppvVar4;
      ppvVar7 = ppvVar7 + 1) {
    paVar5 = ((*ppvVar7)->super__Vector_base<particle_info,_std::allocator<particle_info>_>)._M_impl
             .super__Vector_impl_data._M_finish;
    for (paVar8 = ((*ppvVar7)->super__Vector_base<particle_info,_std::allocator<particle_info>_>).
                  _M_impl.super__Vector_impl_data._M_start; paVar8 != paVar5; paVar8 = paVar8 + 1) {
      dVar9 = paVar8->px;
      dVar1 = paVar8->py;
      paVar8->pT = SQRT(dVar9 * dVar9 + dVar1 * dVar1);
      dVar9 = atan2(dVar1,dVar9);
      paVar8->phi_p = dVar9;
      dVar9 = paVar8->E;
      dVar10 = cosh(rap_shift);
      dVar1 = paVar8->pz;
      dVar11 = sinh(rap_shift);
      dVar2 = paVar8->pz;
      dVar12 = cosh(rap_shift);
      dVar3 = paVar8->E;
      dVar13 = sinh(rap_shift);
      dVar2 = dVar12 * dVar2 + dVar13 * dVar3;
      dVar9 = dVar10 * dVar9 + dVar11 * dVar1;
      auVar6._8_4_ = SUB84(dVar9,0);
      auVar6._0_8_ = dVar2;
      auVar6._12_4_ = (int)((ulong)dVar9 >> 0x20);
      paVar8->pz = dVar2;
      paVar8->E = (double)auVar6._8_8_;
      dVar9 = log((dVar9 + dVar2) / (dVar9 - dVar2));
      paVar8->rap_y = dVar9 * 0.5;
      dVar9 = paVar8->pz;
      dVar1 = SQRT(paVar8->pT * paVar8->pT + dVar9 * dVar9);
      dVar9 = log((dVar9 + dVar1) / (dVar1 - dVar9));
      paVar8->rap_eta = dVar9 * 0.5;
    }
  }
  return;
}

Assistant:

void particleSamples::boostParticles(
    vector<vector<particle_info> *> *input_particle_list,
    const double rap_shift) {
    for (auto &ev_i : (*input_particle_list)) {
        for (auto &part_i : (*ev_i)) {
            part_i.pT = sqrt(part_i.px * part_i.px + part_i.py * part_i.py);
            part_i.phi_p = atan2(part_i.py, part_i.px);
            double E_shifted =
                (part_i.E * cosh(rap_shift) + part_i.pz * sinh(rap_shift));
            double pz_shifted =
                (part_i.pz * cosh(rap_shift) + part_i.E * sinh(rap_shift));
            part_i.E = E_shifted;
            part_i.pz = pz_shifted;

            part_i.rap_y =
                0.5 * log((part_i.E + part_i.pz) / (part_i.E - part_i.pz));
            double p_mag = sqrt(part_i.pT * part_i.pT + part_i.pz * part_i.pz);
            part_i.rap_eta =
                0.5 * log((p_mag + part_i.pz) / (p_mag - part_i.pz));
        }
    }
}